

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O3

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  
  iVar8 = bottom_blob->dims;
  if (iVar8 == 3) {
    iVar8 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    uVar9 = bottom_blob->c;
    Mat::create(top_blob,iVar8,iVar1,uVar9,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)uVar9 < 1) {
      return 0;
    }
    uVar10 = iVar1 * iVar8;
    uVar11 = 0;
    do {
      if (0 < (int)uVar10) {
        sVar4 = bottom_blob->elemsize;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pvVar2 = top_blob->data;
        sVar7 = bottom_blob->cstep;
        pvVar3 = bottom_blob->data;
        uVar12 = 0;
        do {
          fVar13 = roundf(this->scale *
                          *(float *)((long)pvVar3 + uVar12 * 4 + sVar4 * sVar7 * uVar11));
          iVar8 = (int)fVar13;
          if (iVar8 < -0x7e) {
            iVar8 = -0x7f;
          }
          if (0x7e < iVar8) {
            iVar8 = 0x7f;
          }
          *(char *)((long)pvVar2 + uVar12 + sVar5 * sVar6 * uVar11) = (char)iVar8;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar9);
  }
  else if (iVar8 == 2) {
    iVar8 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    Mat::create(top_blob,iVar8,iVar1,1,opt->blob_allocator);
    pvVar2 = top_blob->data;
    if (pvVar2 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar9 = iVar1 * iVar8;
    if ((int)uVar9 < 1) {
      return 0;
    }
    pvVar3 = bottom_blob->data;
    uVar11 = 0;
    do {
      fVar13 = roundf(this->scale * *(float *)((long)pvVar3 + uVar11 * 4));
      iVar8 = (int)fVar13;
      if (iVar8 < -0x7e) {
        iVar8 = -0x7f;
      }
      if (0x7e < iVar8) {
        iVar8 = 0x7f;
      }
      *(char *)((long)pvVar2 + uVar11) = (char)iVar8;
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  else {
    if (iVar8 != 1) {
      return 0;
    }
    uVar9 = bottom_blob->w;
    Mat::create(top_blob,uVar9,1,opt->blob_allocator);
    pvVar2 = top_blob->data;
    if (pvVar2 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)uVar9 < 1) {
      return 0;
    }
    pvVar3 = bottom_blob->data;
    uVar11 = 0;
    do {
      fVar13 = roundf(this->scale * *(float *)((long)pvVar3 + uVar11 * 4));
      iVar8 = (int)fVar13;
      if (iVar8 < -0x7e) {
        iVar8 = -0x7f;
      }
      if (0x7e < iVar8) {
        iVar8 = 0x7f;
      }
      *(char *)((long)pvVar2 + uVar11) = (char)iVar8;
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}